

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rom.cpp
# Opt level: O2

void __thiscall md::ROM::ROM(ROM *this,string *input_path)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  _Rb_tree_header *p_Var1;
  char cVar2;
  ifstream file;
  
  this->_was_open = false;
  this_00 = &this->_byte_array;
  (this->_stored_addresses)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var1 = &(this->_stored_addresses)._M_t._M_impl.super__Rb_tree_header;
  (this->_stored_addresses)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_byte_array).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_byte_array).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_byte_array).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_original_byte_array).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_original_byte_array).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_original_byte_array).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_stored_addresses)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->_stored_addresses)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->_stored_addresses)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->_empty_chunks).
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_empty_chunks).
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_empty_chunks).
  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_00,0x200000);
  std::ifstream::ifstream(&file,(string *)input_path,_S_bin);
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 != '\0') {
    std::istream::read((char *)&file,
                       (long)(this_00->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_start);
    std::ifstream::close();
    this->_was_open = true;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&this->_original_byte_array,this_00);
  std::ifstream::~ifstream(&file);
  return;
}

Assistant:

ROM::ROM(const std::string& input_path) : _was_open(false)
{
    _byte_array.resize(0x200000);
    std::ifstream file(input_path, std::ios::binary);
    if (file.is_open())
    {
        file.read((char*)&(_byte_array[0]), 0x200000);
        file.close();
        _was_open = true;
    }

    // Keep an original copy of the ROM contents to check for double overwrites
    _original_byte_array = _byte_array;
}